

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O2

float Abc_BufComputeArr(Buf_Man_t *p,Abc_Obj_t *pObj)

{
  Abc_Obj_t *pObj_00;
  int iVar1;
  int iVar2;
  int i;
  long lVar3;
  float local_2c;
  
  local_2c = -1e+09;
  for (lVar3 = 0; lVar3 < (pObj->vFanins).nSize; lVar3 = lVar3 + 1) {
    pObj_00 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar3]];
    iVar1 = Vec_IntEntry(p->vOffsets,pObj->Id);
    if (iVar1 != -1000000000) {
      iVar1 = Abc_BufNodeArr(p,pObj_00);
      iVar2 = Abc_BufEdgeDelay(p,pObj,(int)lVar3);
      if (local_2c < (float)(iVar2 + iVar1)) {
        local_2c = (float)(iVar2 + iVar1);
      }
    }
  }
  Abc_BufSetNodeArr(p,pObj,(int)local_2c);
  return local_2c;
}

Assistant:

float Abc_BufComputeArr( Buf_Man_t * p, Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanin;
    int i;
    float DelayF, Delay = -ABC_INFINITY;
    Abc_ObjForEachFanin( pObj, pFanin, i )
    {
        if ( Vec_IntEntry(p->vOffsets, Abc_ObjId(pObj)) == -ABC_INFINITY )
            continue;
        DelayF = Abc_BufNodeArr(p, pFanin) + Abc_BufEdgeDelay(p, pObj, i);
        if ( Delay < DelayF )
            Delay = DelayF;
    }
    Abc_BufSetNodeArr( p, pObj, Delay );
    return Delay;
}